

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

void Llb_Nonlin4CheckVars(Llb_Mgr_t_conflict *p)

{
  int iVar1;
  Llb_Var_t *pLVar2;
  int local_1c;
  int i;
  Llb_Var_t *pVar;
  Llb_Mgr_t_conflict *p_local;
  
  local_1c = 0;
  while( true ) {
    if (p->nVars <= local_1c) {
      return;
    }
    pLVar2 = Llb_MgrVar(p,local_1c);
    if ((pLVar2 != (Llb_Var_t *)0x0) && (iVar1 = Vec_IntSize(pLVar2->vParts), iVar1 < 2)) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Image.c"
                ,0x23b,"void Llb_Nonlin4CheckVars(Llb_Mgr_t *)");
}

Assistant:

void Llb_Nonlin4CheckVars( Llb_Mgr_t * p )
{
    Llb_Var_t * pVar;
    int i;
    Llb_MgrForEachVar( p, pVar, i )
        assert( Vec_IntSize(pVar->vParts) > 1 );
}